

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void duckdb_je_dallocx(void *ptr,int flags)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  void *pvVar4;
  uint64_t uVar5;
  size_t __n;
  long lVar6;
  ushort uVar7;
  undefined8 uVar8;
  tcaches_t *ptVar9;
  tsd_t *tsd;
  ulong uVar10;
  rtree_leaf_elm_t *prVar11;
  anon_union_8_2_150e8edc_for_tcaches_s_0 tcache;
  void **ppvVar12;
  uintptr_t in_RCX;
  ulong *puVar13;
  cache_bin_t *pcVar14;
  uint uVar15;
  long lVar16;
  uintptr_t in_R8;
  cache_bin_t *bin;
  bool bVar17;
  rtree_metadata_t rVar18;
  rtree_ctx_t *rtree_ctx_1;
  uintptr_t args_raw [3];
  te_ctx_t local_78;
  rtree_t *local_50;
  void *local_48;
  long local_40;
  undefined8 local_38;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_02493488);
  bVar17 = true;
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,true);
    bVar17 = (tsd->state).repr == '\0';
  }
  ptVar9 = duckdb_je_tcaches;
  uVar15 = flags & 0xfff00;
  if (uVar15 == 0) {
LAB_01c2a514:
    if (!bVar17) {
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level == '\0') {
        tcache.tcache = (tcache_t *)0x0;
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
          tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
        }
      }
      else {
        tcache.tcache = (tcache_t *)0x0;
      }
LAB_01c2a6b5:
      local_40 = (long)flags;
      local_38 = 0;
      local_48 = ptr;
      duckdb_je_hook_invoke_dalloc(hook_dalloc_dallocx,ptr,(uintptr_t *)&local_48);
      local_50 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      rVar18 = rtree_metadata_read((tsdn_t *)tsd,local_50,(rtree_ctx_t *)ptr,in_RCX);
      uVar15 = rVar18.szind;
      __n = duckdb_je_sz_index2size_tab[uVar15];
      if (duckdb_je_opt_junk_free == true) {
        switchD_01043a80::default(ptr,0x5a,__n);
      }
      if (tcache.tcache == (tcache_t *)0x0) {
        arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
      }
      else if ((rVar18._8_4_ >> 8 & 1) == 0) {
        if ((uVar15 < (tcache.tcache)->tcache_slow->tcache_nbins) &&
           (ppvVar12 = (tcache.tcache)->bins[uVar15].stack_head,
           ppvVar12 != (void **)&duckdb_je_disabled_bin)) {
          pcVar14 = (tcache.tcache)->bins + uVar15;
          if ((tcache.tcache)->bins[uVar15].low_bits_full == (uint16_t)ppvVar12) {
            duckdb_je_tcache_bin_flush_large
                      (tsd,tcache.tcache,pcVar14,uVar15,
                       (uint)((tcache.tcache)->bins[uVar15].bin_info.ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
            ppvVar12 = pcVar14->stack_head;
            if ((tcache.tcache)->bins[uVar15].low_bits_full != (uint16_t)ppvVar12)
            goto LAB_01c2a753;
          }
          else {
            pcVar14->stack_head = ppvVar12 + -1;
            ppvVar12[-1] = ptr;
          }
        }
        else {
          rtree_read((rtree_contents_t *)&local_78,(tsdn_t *)tsd,local_50,(rtree_ctx_t *)ptr,in_R8);
          duckdb_je_large_dalloc
                    ((tsdn_t *)tsd,(edata_t *)CONCAT71(local_78._1_7_,local_78.is_alloc));
        }
      }
      else {
        pcVar14 = (tcache.tcache)->bins + uVar15;
        ppvVar12 = pcVar14->stack_head;
        if ((tcache.tcache)->bins[uVar15].low_bits_full == (uint16_t)ppvVar12) {
          if (ppvVar12 == (void **)&duckdb_je_disabled_bin) {
            duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
          }
          else {
            duckdb_je_tcache_bin_flush_small
                      (tsd,tcache.tcache,pcVar14,uVar15,
                       (uint)((tcache.tcache)->bins[uVar15].bin_info.ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
            ppvVar12 = pcVar14->stack_head;
            if ((tcache.tcache)->bins[uVar15].low_bits_full != (uint16_t)ppvVar12)
            goto LAB_01c2a753;
          }
        }
        else {
LAB_01c2a753:
          pcVar14->stack_head = ppvVar12 + -1;
          ppvVar12[-1] = ptr;
        }
      }
      uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar5 + __n;
      if (__n < tsd->
                cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event
                - uVar5) {
        return;
      }
      goto LAB_01c2a7b0;
    }
    tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
  }
  else {
    if ((uVar15 == 0x100) || (uVar15 >> 8 == 1)) {
      tcache.tcache = (tcache_t *)0x0;
    }
    else {
      if (uVar15 == 0) goto LAB_01c2a514;
      uVar15 = (uVar15 >> 8) - 2;
      tcache = (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcaches[uVar15].field_0.tcache;
      if (tcache == (tcache_t *)0x0) {
        duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n");
        abort();
      }
      if (tcache == (tcache_t *)&DAT_00000001) {
        tcache.tcache = duckdb_je_tcache_create_explicit(tsd);
        ptVar9[uVar15].field_0.tcache = (tcache_t *)tcache;
      }
    }
    if (!bVar17) goto LAB_01c2a6b5;
  }
  uVar10 = (ulong)ptr & 0xffffffffc0000000;
  uVar15 = ((uint)((ulong)ptr >> 0x1e) & 0xf) << 4;
  puVar13 = (ulong *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                             cache[0].leafkey + (ulong)uVar15);
  uVar3 = *puVar13;
  if (uVar3 == uVar10) {
    prVar11 = (rtree_leaf_elm_t *)
              ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) +
              *(long *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
                               ).cache[0].leaf + (ulong)uVar15));
  }
  else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
           leafkey == uVar10) {
    prVar11 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
              leaf;
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
         uVar3;
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
         *(rtree_leaf_elm_t **)
          ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].
                  leaf + (ulong)uVar15);
    *puVar13 = uVar10;
    *(rtree_leaf_elm_t **)
     ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].leaf +
     (ulong)uVar15) = prVar11;
    prVar11 = (rtree_leaf_elm_t *)
              ((long)&(prVar11->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    lVar16 = 0x2d0;
    do {
      if (*(ulong *)((long)tsd + lVar16 + -8) == uVar10) {
        lVar6 = *(long *)(&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                         + lVar16);
        puVar1 = (undefined8 *)((long)tsd + lVar16 + -0x18);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)tsd + lVar16 + -8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        *(ulong *)((long)tsd + lVar16 + -0x18) = uVar3;
        *(undefined8 *)((long)tsd + lVar16 + -0x10) =
             *(undefined8 *)
              ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                      [0].leaf + (ulong)uVar15);
        *puVar13 = uVar10;
        *(long *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                         cache[0].leaf + (ulong)uVar15) = lVar6;
        prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + lVar6);
        goto LAB_01c2a566;
      }
      lVar16 = lVar16 + 0x10;
    } while (lVar16 != 0x340);
    in_R8 = 1;
    prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,
                         &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                         (uintptr_t)ptr,true,false);
  }
LAB_01c2a566:
  pvVar4 = (prVar11->le_bits).repr;
  uVar10 = (ulong)pvVar4 >> 0x30;
  uVar3 = duckdb_je_sz_index2size_tab[uVar10];
  if (tcache.tcache == (tcache_t *)0x0) {
    arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
  }
  else {
    uVar7 = (ushort)((ulong)pvVar4 >> 0x30);
    if (((ulong)pvVar4 & 1) == 0) {
      if (((uint)uVar7 < (tcache.tcache)->tcache_slow->tcache_nbins) &&
         (ppvVar12 = (tcache.tcache)->bins[uVar10].stack_head,
         ppvVar12 != (void **)&duckdb_je_disabled_bin)) {
        pcVar14 = (tcache.tcache)->bins + uVar10;
        if ((tcache.tcache)->bins[uVar10].low_bits_full == (uint16_t)ppvVar12) {
          duckdb_je_tcache_bin_flush_large
                    (tsd,tcache.tcache,pcVar14,(uint)uVar7,
                     (uint)((tcache.tcache)->bins[uVar10].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
          goto LAB_01c2a89b;
        }
        goto LAB_01c2a5a9;
      }
      rtree_read((rtree_contents_t *)&local_78,(tsdn_t *)tsd,
                 (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                 (rtree_ctx_t *)ptr,in_R8);
      duckdb_je_large_dalloc((tsdn_t *)tsd,(edata_t *)CONCAT71(local_78._1_7_,local_78.is_alloc));
    }
    else {
      pcVar14 = (tcache.tcache)->bins + uVar10;
      ppvVar12 = pcVar14->stack_head;
      if ((tcache.tcache)->bins[uVar10].low_bits_full == (uint16_t)ppvVar12) {
        if (ppvVar12 == (void **)&duckdb_je_disabled_bin) {
          duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
        }
        else {
          duckdb_je_tcache_bin_flush_small
                    (tsd,tcache.tcache,pcVar14,(uint)uVar7,
                     (uint)((tcache.tcache)->bins[uVar10].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01c2a89b:
          ppvVar12 = pcVar14->stack_head;
          if (pcVar14->low_bits_full != (uint16_t)ppvVar12) {
            pcVar14->stack_head = ppvVar12 + -1;
            ppvVar12[-1] = ptr;
          }
        }
      }
      else {
LAB_01c2a5a9:
        pcVar14->stack_head = ppvVar12 + -1;
        ppvVar12[-1] = ptr;
      }
    }
  }
  uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar5 + uVar3;
  if (uVar3 < tsd->
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
              uVar5) {
    return;
  }
LAB_01c2a7b0:
  local_78.next_event_fast =
       &tsd->
        cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast;
  local_78.next_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  local_78.last_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  local_78.current = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  local_78.is_alloc = false;
  duckdb_je_te_event_trigger(tsd,&local_78);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_dallocx(void *ptr, int flags) {
	LOG("core.dallocx.entry", "ptr: %p, flags: %d", ptr, flags);

	assert(ptr != NULL);
	assert(malloc_initialized() || IS_INITIALIZER);

	tsd_t *tsd = tsd_fetch_min();
	bool fast = tsd_fast(tsd);
	check_entry_exit_locking(tsd_tsdn(tsd));

	unsigned tcache_ind = mallocx_tcache_get(flags);
	tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind, !fast,
	    /* is_alloc */ false);

	UTRACE(ptr, 0, 0);
	if (likely(fast)) {
		tsd_assert_fast(tsd);
		ifree(tsd, ptr, tcache, false);
	} else {
		uintptr_t args_raw[3] = {(uintptr_t)ptr, flags};
		hook_invoke_dalloc(hook_dalloc_dallocx, ptr, args_raw);
		ifree(tsd, ptr, tcache, true);
	}
	check_entry_exit_locking(tsd_tsdn(tsd));

	LOG("core.dallocx.exit", "");
}